

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void do_config_merge_into(ALLEGRO_CONFIG *master,ALLEGRO_CONFIG *add,_Bool merge_comments)

{
  byte bVar1;
  byte in_DL;
  ALLEGRO_CONFIG *in_RSI;
  ALLEGRO_USTR *in_RDI;
  ALLEGRO_CONFIG_ENTRY *e;
  ALLEGRO_CONFIG_SECTION *s;
  ALLEGRO_CONFIG_ENTRY *local_28;
  ALLEGRO_CONFIG_SECTION *name;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  if (in_RSI != (ALLEGRO_CONFIG *)0x0) {
    for (name = in_RSI->head; name != (ALLEGRO_CONFIG_SECTION *)0x0; name = name->next) {
      config_add_section((ALLEGRO_CONFIG *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                         (ALLEGRO_USTR *)name);
      for (local_28 = name->head; local_28 != (ALLEGRO_CONFIG_ENTRY *)0x0; local_28 = local_28->next
          ) {
        if ((local_28->is_comment & 1U) == 0) {
          config_set_value((ALLEGRO_CONFIG *)e,in_RDI,(ALLEGRO_USTR *)in_RSI,
                           (ALLEGRO_USTR *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        }
        else if ((bVar1 & 1) != 0) {
          config_add_comment(in_RSI,(ALLEGRO_USTR *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                             (ALLEGRO_USTR *)name);
        }
      }
    }
  }
  return;
}

Assistant:

static void do_config_merge_into(ALLEGRO_CONFIG *master,
   const ALLEGRO_CONFIG *add, bool merge_comments)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *e;
   ASSERT(master);

   if (!add) {
      return;
   }

   /* Save each section */
   s = add->head;
   while (s != NULL) {
      config_add_section(master, s->name);
      e = s->head;
      while (e != NULL) {
         if (!e->is_comment) {
            config_set_value(master, s->name, e->key, e->value);
         }
         else if (merge_comments) {
            config_add_comment(master, s->name, e->key);
         }
         e = e->next;
      }
      s = s->next;
   }
}